

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::PrivateToLocalPass::MoveVariable
          (PrivateToLocalPass *this,Instruction *variable,Function *function)

{
  bool bVar1;
  uint32_t uVar2;
  initializer_list<unsigned_int> init_list;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_60;
  uint local_54;
  SmallVector<unsigned_int,_2UL> local_50;
  
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
            (&variable->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  local_60._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
        )(__uniq_ptr_data<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>,_true,_true>
          )variable;
  IRContext::ForgetUses((this->super_Pass).context_,variable);
  local_54 = 7;
  init_list._M_len = 1;
  init_list._M_array = &local_54;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_50,init_list);
  bVar1 = false;
  Instruction::SetInOperand(variable,0,&local_50);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_50);
  uVar2 = Instruction::type_id(variable);
  uVar2 = GetNewType(this,uVar2);
  if (uVar2 != 0) {
    Instruction::SetResultType(variable,uVar2);
    IRContext::AnalyzeUses((this->super_Pass).context_,variable);
    IRContext::set_instr_block
              ((this->super_Pass).context_,variable,
               (BasicBlock *)
               (((function->blocks_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t);
    Instruction::InsertBefore
              (*(Instruction **)
                ((long)(((function->blocks_).
                         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       ._M_t + 0x20),&local_60);
    bVar1 = UpdateUses(this,variable);
    variable = (Instruction *)
               local_60._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (local_60._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
         )0x0) {
      return bVar1;
    }
  }
  (*(variable->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])
            (variable);
  return bVar1;
}

Assistant:

bool PrivateToLocalPass::MoveVariable(Instruction* variable,
                                      Function* function) {
  // The variable needs to be removed from the global section, and placed in the
  // header of the function.  First step remove from the global list.
  variable->RemoveFromList();
  std::unique_ptr<Instruction> var(variable);  // Take ownership.
  context()->ForgetUses(variable);

  // Update the storage class of the variable.
  variable->SetInOperand(kVariableStorageClassInIdx,
                         {uint32_t(spv::StorageClass::Function)});

  // Update the type as well.
  uint32_t new_type_id = GetNewType(variable->type_id());
  if (new_type_id == 0) {
    return false;
  }
  variable->SetResultType(new_type_id);

  // Place the variable at the start of the first basic block.
  context()->AnalyzeUses(variable);
  context()->set_instr_block(variable, &*function->begin());
  function->begin()->begin()->InsertBefore(std::move(var));

  // Update uses where the type may have changed.
  return UpdateUses(variable);
}